

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O2

bool glcts::PipelineStatisticsQueryUtilities::isQuerySupported
               (GLenum value,ContextInfo *context_info,RenderContext *render_context)

{
  bool bVar1;
  ContextType CVar2;
  char *name;
  
  if (value - 0x82f1 < 2) {
    CVar2.super_ApiType.m_bits = (ApiType)(*render_context->_vptr_RenderContext[2])(render_context);
    bVar1 = glu::contextSupports(CVar2,(ApiType)0x204);
    if (bVar1) {
      return true;
    }
    name = "GL_ARB_tessellation_shader";
  }
  else {
    if (value != 0x887f) {
      if (value == 0x82f5) {
        CVar2.super_ApiType.m_bits =
             (ApiType)(*render_context->_vptr_RenderContext[2])(render_context);
        bVar1 = glu::contextSupports(CVar2,(ApiType)0x134);
        if (bVar1) {
          return true;
        }
        name = "GL_ARB_compute_shader";
        goto LAB_00aba927;
      }
      if (value != 0x82f3) {
        return true;
      }
    }
    CVar2.super_ApiType.m_bits = (ApiType)(*render_context->_vptr_RenderContext[2])(render_context);
    bVar1 = glu::contextSupports(CVar2,(ApiType)0x123);
    if (bVar1) {
      return true;
    }
    name = "GL_ARB_geometry_shader4";
  }
LAB_00aba927:
  bVar1 = glu::ContextInfo::isExtensionSupported(context_info,name);
  return bVar1;
}

Assistant:

bool PipelineStatisticsQueryUtilities::isQuerySupported(glw::GLenum value, const glu::ContextInfo& context_info,
														const glu::RenderContext& render_context)
{
	bool result = true;

	switch (value)
	{
	case GL_GEOMETRY_SHADER_INVOCATIONS:
	case GL_GEOMETRY_SHADER_PRIMITIVES_EMITTED_ARB:
	{
		if (!glu::contextSupports(render_context.getType(), glu::ApiType::core(3, 2)) &&
			!context_info.isExtensionSupported("GL_ARB_geometry_shader4"))
		{
			result = false;
		}

		break;
	}

	case GL_TESS_CONTROL_SHADER_PATCHES_ARB:
	case GL_TESS_EVALUATION_SHADER_INVOCATIONS_ARB:
	{
		if (!glu::contextSupports(render_context.getType(), glu::ApiType::compatibility(4, 0)) &&
			!context_info.isExtensionSupported("GL_ARB_tessellation_shader"))
		{
			result = false;
		}

		break;
	}

	case GL_COMPUTE_SHADER_INVOCATIONS_ARB:
	{
		if (!glu::contextSupports(render_context.getType(), glu::ApiType::core(4, 3)) &&
			!context_info.isExtensionSupported("GL_ARB_compute_shader"))
		{
			result = false;
		}

		break;
	}
	} /* switch (value) */

	return result;
}